

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O1

void __thiscall mahjong::MinipointCounter::computePair(MinipointCounter *this)

{
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *pvVar1;
  bool bVar2;
  Tile TVar3;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *__x;
  Pair it;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_38;
  
  __x = &((this->hand->pairs).super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
          _M_impl.super__Vector_impl_data._M_start)->tiles;
  pvVar1 = &((this->hand->pairs).super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
             _M_impl.super__Vector_impl_data._M_finish)->tiles;
  do {
    if (__x == pvVar1) {
      return;
    }
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_38,__x);
    bVar2 = Pair::isDragons((Pair *)&local_38);
    if (bVar2) {
LAB_00195da9:
      this->point = this->point + 2;
    }
    else {
      TVar3 = WiningState::seatWind(this->state);
      bVar2 = Pair::isContain((Pair *)&local_38,TVar3);
      if (bVar2) {
        this->point = this->point + 2;
      }
      TVar3 = WiningState::roundWind(this->state);
      bVar2 = Pair::isContain((Pair *)&local_38,TVar3);
      if (bVar2) goto LAB_00195da9;
    }
    if (local_38.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    __x = __x + 1;
  } while( true );
}

Assistant:

void MinipointCounter::computePair()
{
	for (auto it : hand.pairs)
	{
		if (it.isDragons())
		{
			point += 2;
		}
		else
		{
			if (it.isContain(state.seatWind()))
			{
				point += 2;
			}

			if (it.isContain(state.roundWind()))
			{
				point += 2;
			}
		}
	}
}